

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3DriverBase::~COpenGL3DriverBase(COpenGL3DriverBase *this,void **vtt)

{
  CNullDriver *in_RSI;
  CNullDriver *in_RDI;
  CNullDriver *in_stack_00000090;
  IReferenceCounted *this_00;
  COpenGL3ExtensionHandler *this_01;
  void **vtt_00;
  
  (in_RDI->super_IVideoDriver)._vptr_IVideoDriver = (in_RSI->super_IVideoDriver)._vptr_IVideoDriver;
  *(undefined8 *)
   ((long)&(in_RDI->super_IVideoDriver)._vptr_IVideoDriver +
   (long)(in_RDI->super_IVideoDriver)._vptr_IVideoDriver[-3]) = *(undefined8 *)&in_RSI->field_0x28;
  *(undefined8 *)&(in_RDI->super_IVideoDriver).field_0x8 = 0x43e4f0;
  *(undefined8 *)&in_RDI->field_0x490 = 0x43e530;
  *(undefined8 *)&in_RDI->field_0x498 = 0x43e5a0;
  CNullDriver::deleteMaterialRenders(in_RDI);
  COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  ::getTextureCache((COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
                     *)in_RDI[1].SharedDepthTextures.m_data.
                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  ::STextureCache::clear((STextureCache *)in_RDI);
  (*(in_RDI->super_IVideoDriver)._vptr_IVideoDriver[0x24])();
  CNullDriver::deleteAllTextures(in_stack_00000090);
  (*(in_RDI->super_IVideoDriver)._vptr_IVideoDriver[0x1c])();
  (*(in_RDI->super_IVideoDriver)._vptr_IVideoDriver[0x19])();
  vtt_00 = *(void ***)&in_RDI[1].OverrideMaterial2D.TextureLayers[3].field_0x8;
  if (vtt_00 != (void **)0x0) {
    (**(code **)((long)*vtt_00 + 0x38))();
  }
  this_01 = *(COpenGL3ExtensionHandler **)&in_RDI[1].OverrideMaterial2D.TextureLayers[3].MagFilter;
  if (this_01 != (COpenGL3ExtensionHandler *)0x0) {
    (*(this_01->super_COGLESCoreExtensionHandler)._vptr_COGLESCoreExtensionHandler[7])();
  }
  this_00 = (IReferenceCounted *)
            in_RDI[1].SharedDepthTextures.m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != (IReferenceCounted *)0x0) {
    (**(code **)&(((ITexture *)this_00->_vptr_IReferenceCounted)->NamedPath).Path.str)();
  }
  if (in_RDI[2].OverrideMaterial.Material.TextureLayers[1].Texture != (ITexture *)0x0) {
    (*(in_RDI[2].OverrideMaterial.Material.TextureLayers[1].Texture)->_vptr_ITexture[5])();
    (*(in_RDI[2].OverrideMaterial.Material.TextureLayers[1].Texture)->_vptr_ITexture[3])();
    (*(in_RDI[2].OverrideMaterial.Material.TextureLayers[1].Texture)->_vptr_ITexture[1])();
    IReferenceCounted::drop(this_00);
  }
  SMaterial::~SMaterial((SMaterial *)in_RDI);
  SMaterial::~SMaterial((SMaterial *)in_RDI);
  core::string<char>::~string((string<char> *)0x35cdb6);
  core::array<irr::video::COpenGL3DriverBase::SUserClipPlane>::~array
            ((array<irr::video::COpenGL3DriverBase::SUserClipPlane> *)0x35cdc7);
  SIrrlichtCreationParameters::~SIrrlichtCreationParameters((SIrrlichtCreationParameters *)0x35cdd8)
  ;
  core::string<char>::~string((string<char> *)0x35cde9);
  core::string<char>::~string((string<char> *)0x35cdfa);
  COpenGL3ExtensionHandler::~COpenGL3ExtensionHandler(this_01);
  IMaterialRendererServices::~IMaterialRendererServices
            ((IMaterialRendererServices *)&in_RDI->field_0x490);
  CNullDriver::~CNullDriver(in_RSI,vtt_00);
  return;
}

Assistant:

COpenGL3DriverBase::~COpenGL3DriverBase()
{
	deleteMaterialRenders();

	CacheHandler->getTextureCache().clear();

	removeAllRenderTargets();
	deleteAllTextures();
	removeAllOcclusionQueries();
	removeAllHardwareBuffers();

	delete MaterialRenderer2DTexture;
	delete MaterialRenderer2DNoTexture;
	delete CacheHandler;

	if (ContextManager) {
		ContextManager->destroyContext();
		ContextManager->destroySurface();
		ContextManager->terminate();
		ContextManager->drop();
	}
}